

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IObject>::DoublePtrHelper<Diligent::IObject>::~DoublePtrHelper
          (DoublePtrHelper<Diligent::IObject> *this)

{
  RefCntAutoPtr<Diligent::IObject> *pRVar1;
  IObject *pIVar2;
  IObject *pIVar3;
  
  pRVar1 = this->m_pAutoPtr;
  if (pRVar1 != (RefCntAutoPtr<Diligent::IObject> *)0x0) {
    pIVar2 = pRVar1->m_pObject;
    pIVar3 = this->NewRawPtr;
    if (pIVar2 != pIVar3) {
      if (pIVar2 != (IObject *)0x0) {
        (*pIVar2->_vptr_IObject[2])();
      }
      pRVar1->m_pObject = pIVar3;
    }
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }